

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMemCheckHandler.cxx
# Opt level: O3

void __thiscall
cmCTestMemCheckHandler::TestOutputFileNames
          (cmCTestMemCheckHandler *this,int test,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  uint uVar3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  ostream *poVar6;
  uint uVar7;
  ulong uVar8;
  uint __val;
  uint __len;
  string ofile;
  string log;
  string index;
  Glob g;
  ostringstream cmCTestLog_msg;
  string local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  long *local_240 [2];
  long local_230 [2];
  long *local_220;
  long local_210 [2];
  undefined1 local_200 [16];
  GlobInternals local_1f0;
  undefined1 local_1a8 [376];
  
  __val = -test;
  if (0 < test) {
    __val = test;
  }
  __len = 1;
  if (9 < __val) {
    uVar8 = (ulong)__val;
    uVar3 = 4;
    do {
      __len = uVar3;
      uVar7 = (uint)uVar8;
      if (uVar7 < 100) {
        __len = __len - 2;
        goto LAB_005729ad;
      }
      if (uVar7 < 1000) {
        __len = __len - 1;
        goto LAB_005729ad;
      }
      if (uVar7 < 10000) goto LAB_005729ad;
      uVar8 = uVar8 / 10000;
      uVar3 = __len + 4;
    } while (99999 < uVar7);
    __len = __len + 1;
  }
LAB_005729ad:
  local_240[0] = local_230;
  std::__cxx11::string::_M_construct((ulong)local_240,(char)__len - (char)(test >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)((uint)test >> 0x1f) + (long)local_240[0]),__len,__val);
  pcVar1 = (this->MemoryTesterOutputFile)._M_dataplus._M_p;
  local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_280,pcVar1,pcVar1 + (this->MemoryTesterOutputFile)._M_string_length);
  uVar8 = std::__cxx11::string::find((char *)&local_280,0x7e10de,0);
  std::__cxx11::string::replace((ulong)&local_280,uVar8,(char *)0x2,(ulong)local_240[0]);
  if (this->LogWithPID == true) {
    std::__cxx11::string::append((char *)&local_280);
    cmsys::Glob::Glob((Glob *)local_200);
    cmsys::Glob::FindFiles((Glob *)local_200,&local_280,(GlobMessages *)0x0);
    pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_200);
    if ((pvVar5->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (pvVar5->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)local_200);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(files,pvVar5);
      cmsys::Glob::~Glob((Glob *)local_200);
      goto LAB_00572d05;
    }
    std::operator+(&local_260,"Cannot find memory tester output file: ",&local_280);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a8,local_260._M_dataplus._M_p,local_260._M_string_length);
    std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,6,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                 ,0x57f,(char *)local_220,false);
    if (local_220 != local_210) {
      operator_delete(local_220,local_210[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
    local_280._M_string_length = 0;
    *local_280._M_dataplus._M_p = '\0';
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_dataplus._M_p != &local_260.field_2) {
      operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
    }
    cmsys::Glob::~Glob((Glob *)local_200);
  }
  else {
    bVar4 = cmsys::SystemTools::FileExists(&local_280);
    if (!bVar4) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200,
                     "Cannot find memory tester output file: ",&local_280);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(char *)local_200._0_8_,local_200._8_8_);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestTestHandler).super_cmCTestGenericHandler.CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,6,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestMemCheckHandler.cxx"
                   ,0x587,local_260._M_dataplus._M_p,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_260._M_dataplus._M_p != &local_260.field_2) {
        operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
      local_280._M_string_length = 0;
      *local_280._M_dataplus._M_p = '\0';
      if ((GlobInternals *)local_200._0_8_ != &local_1f0) {
        operator_delete((void *)local_200._0_8_,
                        (ulong)((long)local_1f0.Files.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start + 1));
      }
    }
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,&local_280);
LAB_00572d05:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if (local_240[0] != local_230) {
    operator_delete(local_240[0],local_230[0] + 1);
  }
  return;
}

Assistant:

void cmCTestMemCheckHandler::TestOutputFileNames(
  int test, std::vector<std::string>& files)
{
  std::string index = std::to_string(test);
  std::string ofile = this->MemoryTesterOutputFile;
  std::string::size_type pos = ofile.find("??");
  ofile.replace(pos, 2, index);
  if (this->LogWithPID) {
    ofile += ".*";
    cmsys::Glob g;
    g.FindFiles(ofile);
    if (g.GetFiles().empty()) {
      std::string log = "Cannot find memory tester output file: " + ofile;
      cmCTestLog(this->CTest, WARNING, log << std::endl);
      ofile.clear();
    } else {
      files = g.GetFiles();
      return;
    }
  } else if (!cmSystemTools::FileExists(ofile)) {
    std::string log = "Cannot find memory tester output file: " + ofile;
    cmCTestLog(this->CTest, WARNING, log << std::endl);
    ofile.clear();
  }
  files.push_back(std::move(ofile));
}